

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmt_bin_decode_nvidia.c
# Opt level: O2

uint load_memory_dump(uint pfx,mmt_memory_dump_prefix **dump,mmt_buf **buf,
                     mmt_nvidia_decode_funcs *funcs)

{
  char cVar1;
  uint32_t uVar2;
  char *pcVar3;
  void *pvVar4;
  mmt_memory_dump_prefix *pmVar5;
  mmt_buf *pmVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  
  *dump = (mmt_memory_dump_prefix *)0x0;
  *buf = (mmt_buf *)0x0;
  iVar9 = 0;
  do {
    pcVar3 = (char *)mmt_load_data_with_prefix(1,pfx,1);
    if ((pcVar3 == (char *)0x0) || (*pcVar3 != 'n')) {
      return 0;
    }
    mmt_load_data_with_prefix(2,pfx,0);
    pvVar4 = mmt_load_data_with_prefix(2,pfx,0);
    if (pvVar4 == (void *)0x0) {
      return 0;
    }
    cVar1 = *(char *)((long)pvVar4 + 1);
    switch(cVar1) {
    case 'a':
      if (funcs->alloc_map != (_func_void_mmt_nvidia_alloc_map_ptr_void_ptr *)0x0) {
        return 0;
      }
      load_alloc_map((mmt_nvidia_alloc_map **)0x0,pfx);
      goto LAB_002512d8;
    case 'b':
      if (funcs->bind != (_func_void_mmt_nvidia_bind_ptr_void_ptr *)0x0) {
        return 0;
      }
      load_bind((mmt_nvidia_bind **)0x0,pfx);
      goto LAB_00251316;
    case 'c':
      if (funcs->create_object != (_func_void_mmt_nvidia_create_object_ptr_void_ptr *)0x0) {
        return 0;
      }
      uVar8 = load_create_object((mmt_nvidia_create_object **)0x0,pfx);
      break;
    case 'd':
      if (funcs->destroy_object != (_func_void_mmt_nvidia_destroy_object_ptr_void_ptr *)0x0) {
        return 0;
      }
      load_destroy_object((mmt_nvidia_destroy_object **)0x0,pfx);
      goto LAB_00251316;
    case 'e':
      if (funcs->unmap != (_func_void_mmt_nvidia_unmap_ptr_void_ptr *)0x0) {
        return 0;
      }
      load_unmap((mmt_nvidia_unmap **)0x0,pfx);
      goto LAB_002512d8;
    case 'f':
    case 'i':
    case 'j':
    case 'k':
    case 'n':
    case 'q':
    case 's':
    case 'u':
    case 'w':
      return 0;
    case 'g':
      if (funcs->gpu_map != (_func_void_mmt_nvidia_gpu_map_ptr_void_ptr *)0x0) {
        return 0;
      }
      load_gpu_map((mmt_nvidia_gpu_map **)0x0,pfx);
      goto LAB_00251297;
    case 'h':
      if (funcs->gpu_unmap != (_func_void_mmt_nvidia_gpu_unmap_ptr_void_ptr *)0x0) {
        return 0;
      }
      load_gpu_unmap((mmt_nvidia_gpu_unmap **)0x0,pfx);
      goto LAB_002512d8;
    case 'l':
      if (funcs->call_method != (_func_void_mmt_nvidia_call_method_ptr_void_ptr *)0x0) {
        return 0;
      }
      load_call_method((mmt_nvidia_call_method **)0x0,pfx);
LAB_00251316:
      uVar8 = 0xb;
      break;
    case 'm':
      load_mmap((mmt_nvidia_mmap **)0x0,pfx);
      uVar8 = 0x2f;
      break;
    case 'o':
      goto switchD_0025112f_caseD_6f;
    case 'p':
      if (funcs->create_mapped != (_func_void_mmt_nvidia_create_mapped_object_ptr_void_ptr *)0x0) {
        return 0;
      }
      load_create_mapped_object((mmt_nvidia_create_mapped_object **)0x0,pfx);
LAB_00251297:
      uVar8 = 0x17;
      break;
    case 'r':
      if (funcs->create_driver_object !=
          (_func_void_mmt_nvidia_create_driver_object_ptr_void_ptr *)0x0) {
        return 0;
      }
      load_create_driver_object((mmt_nvidia_create_driver_object **)0x0,pfx);
LAB_002512d8:
      uVar8 = 0x13;
      break;
    case 't':
      if (funcs->create_dma_object != (_func_void_mmt_nvidia_create_dma_object_ptr_void_ptr *)0x0) {
        return 0;
      }
      load_create_dma_object((mmt_nvidia_create_dma_object **)0x0,pfx);
      uVar8 = 0xf;
      break;
    case 'v':
      if (funcs->create_device_object !=
          (_func_void_mmt_nvidia_create_device_object_ptr_void_ptr *)0x0) {
        return 0;
      }
      load_create_device_object((mmt_nvidia_create_device_object **)0x0,pfx);
      goto LAB_00251235;
    case 'x':
      if (funcs->create_context_object !=
          (_func_void_mmt_nvidia_create_context_object_ptr_void_ptr *)0x0) {
        return 0;
      }
      load_create_context_object((mmt_nvidia_create_context_object **)0x0,pfx);
LAB_00251235:
      uVar8 = 7;
      break;
    default:
      if (cVar1 != 'G') {
        if (cVar1 != 'H') {
          return 0;
        }
        if (funcs->gpu_unmap2 != (_func_void_mmt_nvidia_gpu_unmap2_ptr_void_ptr *)0x0) {
          return 0;
        }
        load_gpu_unmap2((mmt_nvidia_gpu_unmap2 **)0x0,pfx);
        goto LAB_00251297;
      }
      if (funcs->gpu_map2 != (_func_void_mmt_nvidia_gpu_map2_ptr_void_ptr *)0x0) {
        return 0;
      }
      load_gpu_map2((mmt_nvidia_gpu_map2 **)0x0,pfx);
      uVar8 = 0x1b;
    }
    iVar9 = iVar9 + uVar8;
    pfx = pfx + uVar8;
  } while (*(char *)((long)pvVar4 + 1) != 'o');
switchD_0025112f_caseD_6f:
  pvVar4 = mmt_load_data_with_prefix(0xe,pfx,0);
  mmt_buf_check_sanity((mmt_buf *)((long)pvVar4 + 10));
  iVar7 = *(int *)((long)pvVar4 + 10);
  pmVar5 = (mmt_memory_dump_prefix *)mmt_load_data_with_prefix(iVar7 + 0xe,pfx,0);
  uVar8 = pfx + iVar7 + 0xe;
  pmVar6 = (mmt_buf *)mmt_load_data_with_prefix(4,uVar8,0);
  mmt_buf_check_sanity(pmVar6);
  uVar2 = pmVar6->len;
  pmVar6 = (mmt_buf *)mmt_load_data_with_prefix(uVar2 + 5,uVar8,0);
  iVar7 = uVar2 + iVar7 + 0x13;
  mmt_check_eor(pfx + iVar7);
  *dump = pmVar5;
  *buf = pmVar6;
  return iVar9 + iVar7;
}

Assistant:

static unsigned int load_memory_dump(unsigned int pfx, struct mmt_memory_dump_prefix **dump,
		struct mmt_buf **buf, struct mmt_nvidia_decode_funcs *funcs)
{
	unsigned int size1, size2, omitted = 0;
	struct mmt_memory_dump_prefix *d;
	struct mmt_buf *b;
	*dump = NULL;
	*buf = NULL;
	struct mmt_message_nv *nv;

	do
	{
		struct mmt_message *msg = mmt_load_data_with_prefix(1, pfx, 1);
		if (msg == NULL || msg->type != 'n')
			return 0;

		mmt_load_data_with_prefix(sizeof(struct mmt_message_nv), pfx, 0);

		nv = mmt_load_data_with_prefix(sizeof(struct mmt_message_nv), pfx, 0);
		if (nv == NULL)
			return 0;

		if (nv->subtype != 'o')
		{
			unsigned int omit;
			if (nv->subtype == 'c' && funcs->create_object == NULL)
				omit = load_create_object(NULL, pfx);
			else if (nv->subtype == 'd' && funcs->destroy_object == NULL)
				omit = load_destroy_object(NULL, pfx);
			else if (nv->subtype == 'l' && funcs->call_method == NULL)
				omit = load_call_method(NULL, pfx);
			else if (nv->subtype == 'p' && funcs->create_mapped == NULL)
				omit = load_create_mapped_object(NULL, pfx);
			else if (nv->subtype == 't' && funcs->create_dma_object == NULL)
				omit = load_create_dma_object(NULL, pfx);
			else if (nv->subtype == 'a' && funcs->alloc_map == NULL)
				omit = load_alloc_map(NULL, pfx);
			else if (nv->subtype == 'g' && funcs->gpu_map == NULL)
				omit = load_gpu_map(NULL, pfx);
			else if (nv->subtype == 'G' && funcs->gpu_map2 == NULL)
				omit = load_gpu_map2(NULL, pfx);
			else if (nv->subtype == 'h' && funcs->gpu_unmap == NULL)
				omit = load_gpu_unmap(NULL, pfx);
			else if (nv->subtype == 'H' && funcs->gpu_unmap2 == NULL)
				omit = load_gpu_unmap2(NULL, pfx);
			else if (nv->subtype == 'm' /*&& funcs->mmap == NULL*/)
				omit = load_mmap(NULL, pfx);
			else if (nv->subtype == 'e' && funcs->unmap == NULL)
				omit = load_unmap(NULL, pfx);
			else if (nv->subtype == 'b' && funcs->bind == NULL)
				omit = load_bind(NULL, pfx);
			else if (nv->subtype == 'r' && funcs->create_driver_object == NULL)
				omit = load_create_driver_object(NULL, pfx);
			else if (nv->subtype == 'v' && funcs->create_device_object == NULL)
				omit = load_create_device_object(NULL, pfx);
			else if (nv->subtype == 'x' && funcs->create_context_object == NULL)
				omit = load_create_context_object(NULL, pfx);
			else
			{
				//if (nv->subtype != 'j' && nv->subtype != 'i')
				//	printf("%d '%c'\n", nv->subtype, nv->subtype);
				return 0;
			}

			omitted += omit;
			pfx += omit;
		}
	}
	while (nv->subtype != 'o');

	size1 = sizeof(struct mmt_memory_dump_prefix);
	d = mmt_load_data_with_prefix(size1, pfx, 0);
	mmt_buf_check_sanity(&d->str);
	size1 += d->str.len;
	d = mmt_load_data_with_prefix(size1, pfx, 0);

	size2 = 4;
	b = mmt_load_data_with_prefix(size2, size1 + pfx, 0);
	mmt_buf_check_sanity(b);
	size2 += b->len + 1;
	b = mmt_load_data_with_prefix(size2, size1 + pfx, 0);

	mmt_check_eor(size2 + size1 + pfx);

	*dump = d;
	*buf = b;

	return size1 + size2 + omitted;
}